

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration.h
# Opt level: O0

void __thiscall
wasm::ValueChildIterator::addChild(ValueChildIterator *this,Expression *parent,Expression **child)

{
  bool bVar1;
  If *pIVar2;
  If *iff;
  Expression **child_local;
  Expression *parent_local;
  ValueChildIterator *this_local;
  
  iff = (If *)child;
  child_local = (Expression **)parent;
  parent_local = (Expression *)this;
  bVar1 = Properties::isControlFlowStructure(parent);
  if (bVar1) {
    pIVar2 = Expression::dynCast<wasm::If>((Expression *)child_local);
    if ((pIVar2 != (If *)0x0) && (iff == (If *)&pIVar2->condition)) {
      SmallVector<wasm::Expression_**,_4UL>::push_back
                ((SmallVector<wasm::Expression_**,_4UL> *)this,(Expression ***)&iff);
    }
  }
  else {
    SmallVector<wasm::Expression_**,_4UL>::push_back
              ((SmallVector<wasm::Expression_**,_4UL> *)this,(Expression ***)&iff);
  }
  return;
}

Assistant:

void addChild(Expression* parent, Expression** child) {
    if (Properties::isControlFlowStructure(parent)) {
      // If conditions are the only value children of control flow structures
      if (auto* iff = parent->dynCast<If>()) {
        if (child == &iff->condition) {
          children.push_back(child);
        }
      }
    } else {
      // All children on non-control flow expressions are value children
      children.push_back(child);
    }
  }